

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

void * pybind11::
       polymorphic_type_hook<anurbs::Curve<2L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>_>,_void>
       ::get(Curve<2L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>_> *src,type_info **type)

{
  _func_int *local_38;
  type_info *local_28;
  type_info **type_local;
  Curve<2L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>_> *src_local;
  
  if (src == (Curve<2L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>_> *)0x0) {
    local_28 = (type_info *)0x0;
  }
  else {
    if (src == (Curve<2L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>_> *)0x0) {
      __cxa_bad_typeid();
    }
    local_28 = (type_info *)(src->super_CurveBase<2L>)._vptr_CurveBase[-1];
  }
  *type = local_28;
  if (src == (Curve<2L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>_> *)0x0) {
    local_38 = (_func_int *)0x0;
  }
  else {
    local_38 = (src->super_CurveBase<2L>)._vptr_CurveBase[-2] +
               (long)&(src->super_CurveBase<2L>)._vptr_CurveBase;
  }
  return local_38;
}

Assistant:

static const void *get(const itype *src, const std::type_info*& type) {
        type = src ? &typeid(*src) : nullptr;
        return dynamic_cast<const void*>(src);
    }